

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

global_state_t * cilkg_init_global_state(void)

{
  int iVar1;
  size_t sVar2;
  global_state_t *g;
  global_state_t *local_8;
  
  if (cilkg_singleton_ptr == (global_state_t *)0x0) {
    local_8 = cilkg_get_user_settable_values();
    if (local_8->max_stacks != 0) {
      if ((int)local_8->max_stacks / local_8->P < local_8->fiber_pool_size) {
        local_8->fiber_pool_size = local_8->max_stacks / (uint)local_8->P;
      }
      if (local_8->fiber_pool_size < 1) {
        local_8->fiber_pool_size = 1;
      }
      if ((int)local_8->max_stacks < local_8->P) {
        local_8->max_stacks = local_8->P;
      }
      local_8->global_fiber_pool_size = local_8->P * (local_8->fiber_pool_size + 1);
    }
    local_8->addr_size = 8;
    __cilkrts_init_stats(&local_8->stats);
    __cilkrts_frame_malloc_global_init(local_8);
    local_8->Q = 0;
    iVar1 = cilkg_calc_total_workers();
    local_8->total_workers = iVar1;
    local_8->system_workers = local_8->P + -1;
    local_8->work_done = 0;
    local_8->workers_running = 0;
    local_8->ltqsize = 0x400;
    sVar2 = cilkos_validate_stack_size(local_8->stack_size);
    local_8->stack_size = sVar2;
    local_8->failure_to_allocate_stack = 0;
  }
  else {
    local_8 = cilkg_singleton_ptr;
  }
  return local_8;
}

Assistant:

global_state_t* cilkg_init_global_state()
{
    if (cilkg_singleton_ptr)
        return cilkg_singleton_ptr;

    // Get partially-initialized global state.
    global_state_t* g = cilkg_get_user_settable_values();

    if (g->max_stacks > 0) {

        // nstacks is currently honored on non-Windows systems only.

        // Set an upper bound on the number of stacks that are allocated.  If
        // nstacks is set, each worker gets up to one stack in its cache so that
        // no one worker can hog all of the free stacks and keep work from being
        // stolen by the other workers.

        // nstacks corresponds to the number of stacks that will be allocated by
        // the runtime apart from the initial stack created for each thread by
        // the system.  Therefore, if a user asks for n stacks, and there are
        // p workers created, the total number of stacks is actually n + p.

        // This feature is primarily for MIC which has flat memory
        // instead of virtual addresses and tends to run out really quickly.
        // It is not implemented for Windows and it's non-intuitive
        // interaction with the local stack cache is specifically to help out
        // MIC.

        // About max_stacks / P stacks, except we require at least 1
        // per pool.
        if (((int)g->max_stacks / g->P) < g->fiber_pool_size)
            g->fiber_pool_size = g->max_stacks / g->P;

        if (g->fiber_pool_size <= 0) {
            g->fiber_pool_size = 1;
        }
        
        if ((int)g->max_stacks < g->P)
            g->max_stacks = g->P;

        g->global_fiber_pool_size = g->P * (g->fiber_pool_size+1);
    }

    // Number of bytes/address - validation for debugger integration
    g->addr_size = sizeof(void *);

    __cilkrts_init_stats(&g->stats);

    __cilkrts_frame_malloc_global_init(g);

    g->Q = 0;
    g->total_workers = cilkg_calc_total_workers();
    g->system_workers = g->P - 1; // system_workers is here for the debugger.
    g->work_done = 0;
    g->workers_running = 0;
    g->ltqsize = 1024; /* FIXME */

    g->stack_size = cilkos_validate_stack_size(g->stack_size);
    g->failure_to_allocate_stack = 0;

    return g;
}